

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publisher_link.cpp
# Opt level: O1

void __thiscall
miniros::PublisherLink::PublisherLink
          (PublisherLink *this,SubscriptionPtr *parent,string *xmlrpc_uri,
          TransportHints *transport_hints)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  
  (this->super_enable_shared_from_this<miniros::PublisherLink>)._M_weak_this.
  super___weak_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<miniros::PublisherLink>)._M_weak_this.
  super___weak_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_PublisherLink = (_func_int **)&PTR__PublisherLink_002ac0d8;
  (this->parent_).super___weak_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (parent->super___shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (parent->super___shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->parent_).super___weak_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_weak_count = p_Var1->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_weak_count = p_Var1->_M_weak_count + 1;
    }
  }
  this->connection_id_ = 0;
  (this->publisher_xmlrpc_uri_)._M_dataplus._M_p = (pointer)&(this->publisher_xmlrpc_uri_).field_2;
  pcVar2 = (xmlrpc_uri->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->publisher_xmlrpc_uri_,pcVar2,pcVar2 + xmlrpc_uri->_M_string_length);
  (this->stats_).bytes_received_ = 0;
  (this->stats_).messages_received_ = 0;
  (this->stats_).drops_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&(this->transport_hints_).transports_,&transport_hints->transports_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&(this->transport_hints_).options_._M_t,&(transport_hints->options_)._M_t);
  this->latched_ = false;
  (this->caller_id_)._M_dataplus._M_p = (pointer)&(this->caller_id_).field_2;
  (this->caller_id_)._M_string_length = 0;
  (this->caller_id_).field_2._M_local_buf[0] = '\0';
  Header::Header(&this->header_);
  (this->md5sum_)._M_dataplus._M_p = (pointer)&(this->md5sum_).field_2;
  (this->md5sum_)._M_string_length = 0;
  (this->md5sum_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

PublisherLink::PublisherLink(const SubscriptionPtr& parent, const std::string& xmlrpc_uri, 
			     const TransportHints& transport_hints)
: parent_(parent)
, connection_id_(0)
, publisher_xmlrpc_uri_(xmlrpc_uri)
, transport_hints_(transport_hints)
, latched_(false)
{ }